

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchCnf.c
# Opt level: O1

void Dch_AddClausesSuper(Dch_Man_t *p,Aig_Obj_t *pNode,Vec_Ptr_t *vSuper)

{
  uint uVar1;
  int *piVar2;
  void **ppvVar3;
  Dch_Pars_t *pDVar4;
  int iVar5;
  uint *begin;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchCnf.c"
                  ,0xa8,"void Dch_AddClausesSuper(Dch_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  if ((*(uint *)&pNode->field_0x18 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode( pNode )",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchCnf.c"
                  ,0xa9,"void Dch_AddClausesSuper(Dch_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  uVar8 = vSuper->nSize;
  lVar10 = (long)(int)uVar8;
  begin = (uint *)malloc(lVar10 * 4 + 4);
  if (0 < lVar10) {
    lVar7 = 0;
    do {
      uVar6 = (ulong)vSuper->pArray[lVar7] & 0xfffffffffffffffe;
      piVar2 = p->pSatVars;
      uVar8 = ((uint)vSuper->pArray[lVar7] & 1) + piVar2[*(int *)(uVar6 + 0x24)] * 2;
      *begin = uVar8;
      begin[1] = piVar2[pNode->Id] * 2 + 1;
      if (p->pPars->fPolarFlip != 0) {
        if ((*(byte *)(uVar6 + 0x18) & 8) != 0) {
          *begin = uVar8 ^ 1;
        }
        if ((pNode->field_0x18 & 8) != 0) {
          *(byte *)(begin + 1) = (byte)begin[1] ^ 1;
        }
      }
      iVar5 = sat_solver_addclause(p->pSat,(lit *)begin,(lit *)(begin + 2));
      if (iVar5 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchCnf.c"
                      ,0xb9,"void Dch_AddClausesSuper(Dch_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
      }
      lVar7 = lVar7 + 1;
      uVar8 = vSuper->nSize;
    } while (lVar7 < (int)uVar8);
  }
  if (0 < (int)uVar8) {
    ppvVar3 = vSuper->pArray;
    pDVar4 = p->pPars;
    piVar2 = p->pSatVars;
    uVar6 = 0;
    do {
      uVar9 = (ulong)ppvVar3[uVar6] & 0xfffffffffffffffe;
      uVar1 = ((uint)ppvVar3[uVar6] & 1) + piVar2[*(int *)(uVar9 + 0x24)] * 2;
      begin[uVar6] = uVar1 ^ 1;
      if ((pDVar4->fPolarFlip != 0) && ((*(byte *)(uVar9 + 0x18) & 8) != 0)) {
        begin[uVar6] = uVar1;
      }
      uVar6 = uVar6 + 1;
    } while (uVar8 != uVar6);
  }
  uVar8 = p->pSatVars[pNode->Id] * 2;
  begin[lVar10] = uVar8;
  if ((p->pPars->fPolarFlip != 0) && ((pNode->field_0x18 & 8) != 0)) {
    begin[lVar10] = uVar8 | 1;
  }
  iVar5 = sat_solver_addclause(p->pSat,(lit *)begin,(lit *)(begin + lVar10 + 1));
  if (iVar5 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchCnf.c"
                  ,0xca,"void Dch_AddClausesSuper(Dch_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  if (begin == (uint *)0x0) {
    return;
  }
  free(begin);
  return;
}

Assistant:

void Dch_AddClausesSuper( Dch_Man_t * p, Aig_Obj_t * pNode, Vec_Ptr_t * vSuper )
{
    Aig_Obj_t * pFanin;
    int * pLits, nLits, RetValue, i;
    assert( !Aig_IsComplement(pNode) );
    assert( Aig_ObjIsNode( pNode ) );
    // create storage for literals
    nLits = Vec_PtrSize(vSuper) + 1;
    pLits = ABC_ALLOC( int, nLits );
    // suppose AND-gate is A & B = C
    // add !A => !C   or   A + !C
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pFanin, i )
    {
        pLits[0] = toLitCond(Dch_ObjSatNum(p,Aig_Regular(pFanin)), Aig_IsComplement(pFanin));
        pLits[1] = toLitCond(Dch_ObjSatNum(p,pNode), 1);
        if ( p->pPars->fPolarFlip )
        {
            if ( Aig_Regular(pFanin)->fPhase )  pLits[0] = lit_neg( pLits[0] );
            if ( pNode->fPhase )                pLits[1] = lit_neg( pLits[1] );
        }
        RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
        assert( RetValue );
    }
    // add A & B => C   or   !A + !B + C
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pFanin, i )
    {
        pLits[i] = toLitCond(Dch_ObjSatNum(p,Aig_Regular(pFanin)), !Aig_IsComplement(pFanin));
        if ( p->pPars->fPolarFlip )
        {
            if ( Aig_Regular(pFanin)->fPhase )  pLits[i] = lit_neg( pLits[i] );
        }
    }
    pLits[nLits-1] = toLitCond(Dch_ObjSatNum(p,pNode), 0);
    if ( p->pPars->fPolarFlip )
    {
        if ( pNode->fPhase )  pLits[nLits-1] = lit_neg( pLits[nLits-1] );
    }
    RetValue = sat_solver_addclause( p->pSat, pLits, pLits + nLits );
    assert( RetValue );
    ABC_FREE( pLits );
}